

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupCommandLineArguments::TEST_GROUP_CppUTestGroupCommandLineArguments
          (TEST_GROUP_CppUTestGroupCommandLineArguments *this)

{
  TEST_GROUP_CppUTestGroupCommandLineArguments *this_local;
  
  Utest::Utest(&this->super_Utest);
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupCommandLineArguments_003c8840;
  return;
}

Assistant:

TEST_GROUP(CommandLineArguments)
{
    CommandLineArguments* args;
    OptionsPlugin* plugin;

    void setup() _override
    {
        plugin = new OptionsPlugin("options");
        args = NULLPTR;
    }
    void teardown() _override
    {
        delete args;
        delete plugin;
    }

    bool newArgumentParser(int argc, const char *const *argv)
    {
        args = new CommandLineArguments(argc, argv);
        return args->parse(plugin);
    }
}